

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

uint ** Extra_TruthPerm53(void)

{
  uint uVar1;
  uint **ppuVar2;
  int local_1c;
  uint local_18;
  int k;
  int i;
  uint uTruth;
  uint **pTable;
  
  ppuVar2 = (uint **)Extra_ArrayAlloc(0x100,0x20,4);
  for (local_18 = 0; (int)local_18 < 0x100; local_18 = local_18 + 1) {
    for (local_1c = 0; local_1c < 0x20; local_1c = local_1c + 1) {
      uVar1 = Extra_TruthPerm5One(local_18 << 0x18 | local_18 << 0x10 | local_18 << 8 | local_18,
                                  local_1c);
      ppuVar2[(int)local_18][local_1c] = uVar1;
    }
  }
  return ppuVar2;
}

Assistant:

unsigned ** Extra_TruthPerm53()
{
    unsigned ** pTable;
    unsigned uTruth;
    int i, k;
    pTable = (unsigned **)Extra_ArrayAlloc( 256, 32, 4 );
    for ( i = 0; i < 256; i++ )
    {
        uTruth = (i << 24) | (i << 16) | (i << 8) | i;
        for ( k = 0; k < 32; k++ )
            pTable[i][k] = Extra_TruthPerm5One( uTruth, k );
    }
    return pTable;
}